

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleDateFormat::compareSimpleAffix
          (SimpleDateFormat *this,UnicodeString *affix,UnicodeString *input,int32_t pos)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  int32_t iVar5;
  bool bVar6;
  int32_t s;
  uint uStack_38;
  UBool literalMatch;
  int32_t len;
  UChar32 c;
  int32_t i;
  int32_t start;
  int32_t pos_local;
  UnicodeString *input_local;
  UnicodeString *affix_local;
  SimpleDateFormat *this_local;
  
  len = 0;
  i = pos;
  do {
    while( true ) {
      iVar3 = icu_63::UnicodeString::length(affix);
      if (iVar3 <= len) {
        return i - pos;
      }
      uStack_38 = icu_63::UnicodeString::char32At(affix,len);
      s = 2;
      if (uStack_38 < 0x10000) {
        s = 1;
      }
      UVar2 = PatternProps::isWhiteSpace(uStack_38);
      if (UVar2 != '\0') break;
      iVar3 = icu_63::UnicodeString::length(input);
      if ((iVar3 <= i) || (uVar4 = icu_63::UnicodeString::char32At(input,i), uVar4 != uStack_38)) {
        return -1;
      }
      len = s + len;
      i = s + i;
    }
    bVar1 = false;
    do {
      iVar3 = icu_63::UnicodeString::length(input);
      bVar6 = false;
      if (i < iVar3) {
        uVar4 = icu_63::UnicodeString::char32At(input,i);
        bVar6 = uVar4 == uStack_38;
      }
      if (!bVar6) break;
      bVar1 = true;
      len = s + len;
      i = s + i;
      iVar3 = icu_63::UnicodeString::length(affix);
      if (len == iVar3) break;
      uStack_38 = icu_63::UnicodeString::char32At(affix,len);
      s = 2;
      if (uStack_38 < 0x10000) {
        s = 1;
      }
      UVar2 = PatternProps::isWhiteSpace(uStack_38);
    } while (UVar2 != '\0');
    iVar3 = skipPatternWhiteSpace(this,affix,len);
    iVar5 = skipUWhiteSpace(this,input,i);
    if ((iVar5 == i) && (!bVar1)) {
      return -1;
    }
    len = skipUWhiteSpace(this,affix,iVar3);
    i = iVar5;
  } while( true );
}

Assistant:

int32_t
SimpleDateFormat::compareSimpleAffix(const UnicodeString& affix,
                   const UnicodeString& input,
                   int32_t pos) const {
    int32_t start = pos;
    for (int32_t i=0; i<affix.length(); ) {
        UChar32 c = affix.char32At(i);
        int32_t len = U16_LENGTH(c);
        if (PatternProps::isWhiteSpace(c)) {
            // We may have a pattern like: \u200F \u0020
            //        and input text like: \u200F \u0020
            // Note that U+200F and U+0020 are Pattern_White_Space but only
            // U+0020 is UWhiteSpace.  So we have to first do a direct
            // match of the run of Pattern_White_Space in the pattern,
            // then match any extra characters.
            UBool literalMatch = FALSE;
            while (pos < input.length() &&
                   input.char32At(pos) == c) {
                literalMatch = TRUE;
                i += len;
                pos += len;
                if (i == affix.length()) {
                    break;
                }
                c = affix.char32At(i);
                len = U16_LENGTH(c);
                if (!PatternProps::isWhiteSpace(c)) {
                    break;
                }
            }

            // Advance over run in pattern
            i = skipPatternWhiteSpace(affix, i);

            // Advance over run in input text
            // Must see at least one white space char in input,
            // unless we've already matched some characters literally.
            int32_t s = pos;
            pos = skipUWhiteSpace(input, pos);
            if (pos == s && !literalMatch) {
                return -1;
            }

            // If we skip UWhiteSpace in the input text, we need to skip it in the pattern.
            // Otherwise, the previous lines may have skipped over text (such as U+00A0) that
            // is also in the affix.
            i = skipUWhiteSpace(affix, i);
        } else {
            if (pos < input.length() &&
                input.char32At(pos) == c) {
                i += len;
                pos += len;
            } else {
                return -1;
            }
        }
    }
    return pos - start;
}